

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceMatrixDecomposition.cpp
# Opt level: O1

Vector3d * __thiscall
OpenMD::ForceMatrixDecomposition::getAtomToGroupVectorColumn
          (Vector3d *__return_storage_ptr__,ForceMatrixDecomposition *this,int atom2,int cg2)

{
  Snapshot *this_00;
  pointer pVVar1;
  pointer pVVar2;
  uint i;
  long lVar3;
  Vector<double,_3U> result;
  double local_28 [4];
  
  lVar3 = 0;
  (__return_storage_ptr__->super_Vector<double,_3U>).data_[2] = 0.0;
  (__return_storage_ptr__->super_Vector<double,_3U>).data_[0] = 0.0;
  (__return_storage_ptr__->super_Vector<double,_3U>).data_[1] = 0.0;
  this_00 = (this->super_ForceDecomposition).snap_;
  pVVar1 = (this_00->cgData).position.
           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar2 = (this_00->atomData).position.
           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_28[2] = 0.0;
  local_28[0] = 0.0;
  local_28[1] = 0.0;
  do {
    local_28[lVar3] =
         *(double *)((long)pVVar1[cg2].super_Vector<double,_3U>.data_ + lVar3 * 8) -
         *(double *)((long)(pVVar2 + atom2) + lVar3 * 8);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  (__return_storage_ptr__->super_Vector<double,_3U>).data_[2] = local_28[2];
  (__return_storage_ptr__->super_Vector<double,_3U>).data_[0] = local_28[0];
  (__return_storage_ptr__->super_Vector<double,_3U>).data_[1] = local_28[1];
  if ((this->super_ForceDecomposition).usePeriodicBoundaryConditions_ == true) {
    Snapshot::wrapVector(this_00,__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Vector3d ForceMatrixDecomposition::getAtomToGroupVectorColumn(int atom2,
                                                                int cg2) {
    Vector3d d;

#ifdef IS_MPI
    d = cgColData.position[cg2] - atomColData.position[atom2];
#else
    d = snap_->cgData.position[cg2] - snap_->atomData.position[atom2];
#endif
    if (usePeriodicBoundaryConditions_) { snap_->wrapVector(d); }
    return d;
  }